

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_checkBufferStability
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  size_t outBufferSize;
  ZSTD_inBuffer expect;
  ZSTD_EndDirective endOp_local;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_CCtx *cctx_local;
  
  if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
    if ((((cctx->expectedInBuffer).src != input->src) ||
        ((cctx->expectedInBuffer).pos != input->pos)) ||
       ((cctx->expectedInBuffer).size != input->size)) {
      return 0xffffffffffffff97;
    }
    if (endOp != ZSTD_e_end) {
      return 0xffffffffffffff97;
    }
  }
  if (((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) &&
     (cctx->expectedOutBufferSize != output->size - output->pos)) {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffff98;
  }
  else {
    cctx_local = (ZSTD_CCtx *)0x0;
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_checkBufferStability(ZSTD_CCtx const* cctx,
                                        ZSTD_outBuffer const* output,
                                        ZSTD_inBuffer const* input,
                                        ZSTD_EndDirective endOp)
{
    if (cctx->appliedParams.inBufferMode == ZSTD_bm_stable) {
        ZSTD_inBuffer const expect = cctx->expectedInBuffer;
        if (expect.src != input->src || expect.pos != input->pos || expect.size != input->size)
            RETURN_ERROR(srcBuffer_wrong, "ZSTD_c_stableInBuffer enabled but input differs!");
        if (endOp != ZSTD_e_end)
            RETURN_ERROR(srcBuffer_wrong, "ZSTD_c_stableInBuffer can only be used with ZSTD_e_end!");
    }
    if (cctx->appliedParams.outBufferMode == ZSTD_bm_stable) {
        size_t const outBufferSize = output->size - output->pos;
        if (cctx->expectedOutBufferSize != outBufferSize)
            RETURN_ERROR(dstBuffer_wrong, "ZSTD_c_stableOutBuffer enabled but output size differs!");
    }
    return 0;
}